

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::PointwiseMatcher<iutest::detail::TwofoldEqMatcher,_int[3]>::~PointwiseMatcher
          (PointwiseMatcher<iutest::detail::TwofoldEqMatcher,_int[3]> *this)

{
  PointwiseMatcher<iutest::detail::TwofoldEqMatcher,_int[3]> *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_whichIs);
  TwofoldEqMatcher::~TwofoldEqMatcher(&this->m_matcher);
  IMatcher::~IMatcher(&this->super_IMatcher);
  return;
}

Assistant:

class PointwiseMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    PointwiseMatcher(const M& matcher, const T& expected)
        : m_matcher(matcher), m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        IUTEST_USING_BEGIN_END();
        if IUTEST_COND_LIKELY( Check(begin(m_expected), end(m_expected)
            , begin(actual), end(actual)) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "Pointwise: " << m_matcher << ": " << PrintToString(m_expected);
        strm << " (" << m_whichIs << ")";
        return strm.str();
    }